

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::push_float(PrintC *this,uintb val,int4 sz,Varnode *vn,PcodeOp *op)

{
  bool bVar1;
  string local_258 [32];
  Atom local_238;
  string local_210 [32];
  Atom local_1f0;
  double local_1c8;
  double floatval;
  floatclass type;
  FloatFormat *local_1b0;
  FloatFormat *format;
  ostringstream t;
  PcodeOp *op_local;
  Varnode *vn_local;
  int4 sz_local;
  uintb val_local;
  PrintC *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&format);
  local_1b0 = Translate::getFloatFormat(((this->super_PrintLanguage).glb)->translate,sz);
  if (local_1b0 == (FloatFormat *)0x0) {
    std::operator<<((ostream *)&format,"FLOAT_UNKNOWN");
  }
  else {
    local_1c8 = FloatFormat::getHostFloat(local_1b0,val,(floatclass *)&floatval);
    if (floatval._0_4_ == 1) {
      bVar1 = FloatFormat::extractSign(local_1b0,val);
      if (bVar1) {
        std::operator<<((ostream *)&format,'-');
      }
      std::operator<<((ostream *)&format,"INFINITY");
    }
    else if (floatval._0_4_ == 3) {
      bVar1 = FloatFormat::extractSign(local_1b0,val);
      if (bVar1) {
        std::operator<<((ostream *)&format,'-');
      }
      std::operator<<((ostream *)&format,"NAN");
    }
    else {
      if (((this->super_PrintLanguage).mods & 8) == 0) {
        std::ios_base::setf((ios_base *)((long)&format + *(long *)&format[-1].frac_size),_S_fixed);
      }
      else {
        std::ios_base::setf((ios_base *)((long)&format + *(long *)&format[-1].frac_size),
                            _S_scientific);
      }
      std::ios_base::precision((ios_base *)((long)&format + *(long *)&format[-1].frac_size),8);
      std::ostream::operator<<(&format,local_1c8);
    }
  }
  if (vn == (Varnode *)0x0) {
    std::__cxx11::ostringstream::str();
    PrintLanguage::Atom::Atom(&local_1f0,local_210,syntax,const_color,op);
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_1f0);
    std::__cxx11::string::~string((string *)local_210);
  }
  else {
    std::__cxx11::ostringstream::str();
    PrintLanguage::Atom::Atom(&local_238,local_258,vartoken,const_color,op,vn);
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_238);
    std::__cxx11::string::~string((string *)local_258);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&format);
  return;
}

Assistant:

void PrintC::push_float(uintb val,int4 sz,const Varnode *vn,const PcodeOp *op)
{
  ostringstream t;

  const FloatFormat *format = glb->translate->getFloatFormat(sz);
  if (format == (const FloatFormat *)0) {
    t << "FLOAT_UNKNOWN";
  }
  else {
    FloatFormat::floatclass type;
    double floatval = format->getHostFloat(val,&type);
    if (type == FloatFormat::infinity) {
      if (format->extractSign(val))
	t << '-';
      t << "INFINITY";
    }
    else if (type == FloatFormat::nan) {
      if (format->extractSign(val))
	t << '-';
      t << "NAN";
    }
    else {
      if ((mods & force_scinote)!=0)
	t.setf( ios::scientific ); // Set to scientific notation
      else
	t.setf( ios::fixed );	// Otherwise use fixed notation
      t.precision(8);		// Number of digits of precision
      t << floatval;
    }
  }
  if (vn==(const Varnode *)0)
    pushAtom(Atom(t.str(),syntax,EmitXml::const_color,op));
  else
    pushAtom(Atom(t.str(),vartoken,EmitXml::const_color,op,vn));
}